

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O2

_Bool los(chunk_conflict *c,loc_conflict grid1,loc_conflict grid2)

{
  _Bool _Var1;
  _Bool _Var2;
  uint uVar3;
  loc lVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  iVar12 = grid1.y;
  iVar10 = grid2.y;
  uVar9 = iVar10 - iVar12;
  iVar13 = grid2.x;
  iVar15 = grid1.x;
  uVar11 = iVar13 - iVar15;
  uVar8 = -uVar9;
  if (0 < (int)uVar9) {
    uVar8 = uVar9;
  }
  uVar5 = -uVar11;
  if (0 < (int)uVar11) {
    uVar5 = uVar11;
  }
  if (uVar5 < 2 && uVar8 < 2) {
    return true;
  }
  if (iVar13 == iVar15) {
    if ((int)uVar9 < 1) {
      do {
        iVar12 = iVar12 + -1;
        if (iVar12 <= iVar10) {
          return iVar12 <= iVar10;
        }
        lVar4 = (loc)loc(iVar15,iVar12);
        _Var1 = square_isprojectable(c,lVar4);
      } while (_Var1);
      return iVar12 <= iVar10;
    }
    do {
      iVar12 = iVar12 + 1;
      if (iVar10 <= iVar12) {
        return iVar10 <= iVar12;
      }
      lVar4 = (loc)loc(iVar15,iVar12);
      _Var1 = square_isprojectable(c,lVar4);
    } while (_Var1);
    return iVar10 <= iVar12;
  }
  if (iVar10 == iVar12) {
    if ((int)uVar11 < 1) {
      do {
        iVar15 = iVar15 + -1;
        if (iVar15 <= iVar13) {
          return iVar15 <= iVar13;
        }
        lVar4 = (loc)loc(iVar15,iVar12);
        _Var1 = square_isprojectable(c,lVar4);
      } while (_Var1);
      return iVar15 <= iVar13;
    }
    do {
      iVar15 = iVar15 + 1;
      if (iVar13 <= iVar15) {
        return iVar13 <= iVar15;
      }
      lVar4 = (loc)loc(iVar15,iVar12);
      _Var1 = square_isprojectable(c,lVar4);
    } while (_Var1);
    return iVar13 <= iVar15;
  }
  uVar3 = (int)uVar11 >> 0x1f | 1;
  uVar6 = (int)uVar9 >> 0x1f | 1;
  if (uVar8 == 2 && uVar5 == 1) {
    iVar7 = uVar6 + iVar12;
    iVar14 = iVar15;
  }
  else {
    if (uVar5 != 2 || uVar8 != 1) goto LAB_0012a5ff;
    iVar14 = uVar3 + iVar15;
    iVar7 = iVar12;
  }
  lVar4 = (loc)loc(iVar14,iVar7);
  _Var1 = square_isprojectable(c,lVar4);
  if (_Var1) {
    return true;
  }
LAB_0012a5ff:
  iVar7 = uVar8 * uVar5;
  if (uVar5 < uVar8) {
    iVar13 = uVar11 * uVar11;
    uVar8 = 0;
    if (iVar13 == iVar7) {
      uVar8 = uVar3;
    }
    iVar14 = 0;
    if (iVar13 == iVar7) {
      iVar14 = iVar7 * 2;
    }
    iVar15 = uVar8 + iVar15;
    iVar14 = iVar13 - iVar14;
    while( true ) {
      iVar12 = uVar6 + iVar12;
      _Var1 = iVar10 == iVar12;
      if (_Var1) break;
      lVar4 = (loc)loc(iVar15,iVar12);
      _Var2 = square_isprojectable(c,lVar4);
      if (!_Var2) {
        return _Var1;
      }
      iVar14 = iVar14 + iVar13 * 2;
      if (iVar7 <= iVar14) {
        iVar15 = iVar15 + uVar3;
        if (iVar7 < iVar14) {
          lVar4 = (loc)loc(iVar15,iVar12);
          _Var2 = square_isprojectable(c,lVar4);
          if (!_Var2) {
            return _Var1;
          }
          iVar14 = iVar14 + iVar7 * -2;
        }
        else {
          iVar14 = iVar14 + iVar7 * -2;
        }
      }
    }
  }
  else {
    iVar14 = uVar9 * uVar9;
    iVar10 = 0;
    uVar8 = 0;
    if (iVar14 == iVar7) {
      iVar10 = iVar7 * 2;
      uVar8 = uVar6;
    }
    iVar12 = uVar8 + iVar12;
    iVar10 = iVar14 - iVar10;
    while( true ) {
      iVar15 = iVar15 + uVar3;
      _Var1 = iVar13 == iVar15;
      if (_Var1) break;
      lVar4 = (loc)loc(iVar15,iVar12);
      _Var2 = square_isprojectable(c,lVar4);
      if (!_Var2) {
        return _Var1;
      }
      iVar10 = iVar10 + iVar14 * 2;
      if (iVar7 <= iVar10) {
        iVar12 = iVar12 + uVar6;
        if (iVar7 < iVar10) {
          lVar4 = (loc)loc(iVar15,iVar12);
          _Var2 = square_isprojectable(c,lVar4);
          if (!_Var2) {
            return _Var1;
          }
          iVar10 = iVar10 + iVar7 * -2;
        }
        else {
          iVar10 = iVar10 + iVar7 * -2;
        }
      }
    }
  }
  return _Var1;
}

Assistant:

bool los(struct chunk *c, struct loc grid1, struct loc grid2)
{
	/* Delta */
	int dx, dy;

	/* Absolute */
	int ax, ay;

	/* Signs */
	int sx, sy;

	/* Fractions */
	int qx, qy;

	/* Scanners */
	int tx, ty;

	/* Scale factors */
	int f1, f2;

	/* Slope, or 1/Slope, of LOS */
	int m;

	/* Extract the offset */
	dy = grid2.y - grid1.y;
	dx = grid2.x - grid1.x;

	/* Extract the absolute offset */
	ay = ABS(dy);
	ax = ABS(dx);

	/* Handle adjacent (or identical) grids */
	if ((ax < 2) && (ay < 2)) return (true);

	/* Directly South/North */
	if (!dx) {
		/* South -- check for walls */
		if (dy > 0) {
			for (ty = grid1.y + 1; ty < grid2.y; ty++)
				if (!square_isprojectable(c, loc(grid1.x, ty))) return (false);
		} else { /* North -- check for walls */
			for (ty = grid1.y - 1; ty > grid2.y; ty--)
				if (!square_isprojectable(c, loc(grid1.x, ty))) return (false);
		}

		/* Assume los */
		return (true);
	}

	/* Directly East/West */
	if (!dy) {
		/* East -- check for walls */
		if (dx > 0) {
			for (tx = grid1.x + 1; tx < grid2.x; tx++)
				if (!square_isprojectable(c, loc(tx, grid1.y))) return (false);
		} else { /* West -- check for walls */
			for (tx = grid1.x - 1; tx > grid2.x; tx--)
				if (!square_isprojectable(c, loc(tx, grid1.y))) return (false);
		}

		/* Assume los */
		return (true);
	}


	/* Extract some signs */
	sx = (dx < 0) ? -1 : 1;
	sy = (dy < 0) ? -1 : 1;

	/* Vertical and horizontal "knights" */
	if ((ax == 1) && (ay == 2) &&
		square_isprojectable(c, loc(grid1.x, grid1.y + sy))) {
		return (true);
	} else if ((ay == 1) && (ax == 2) &&
			   square_isprojectable(c, loc(grid1.x + sx, grid1.y))) {
		return (true);
	}

	/* Calculate scale factor div 2 */
	f2 = (ax * ay);

	/* Calculate scale factor */
	f1 = f2 << 1;


	/* Travel horizontally */
	if (ax >= ay) {
		/* Let m = dy / dx * 2 * (dy * dx) = 2 * dy * dy */
		qy = ay * ay;
		m = qy << 1;

		tx = grid1.x + sx;

		/* Consider the special case where slope == 1. */
		if (qy == f2) {
			ty = grid1.y + sy;
			qy -= f1;
		} else {
			ty = grid1.y;
		}

		/* Note (below) the case (qy == f2), where */
		/* the LOS exactly meets the corner of a tile. */
		while (grid2.x - tx) {
			if (!square_isprojectable(c, loc(tx, ty)))
				return (false);

			qy += m;

			if (qy < f2) {
				tx += sx;
			} else if (qy > f2) {
				ty += sy;
				if (!square_isprojectable(c, loc(tx, ty)))
					return (false);
				qy -= f1;
				tx += sx;
			} else {
				ty += sy;
				qy -= f1;
				tx += sx;
			}
		}
	} else { /* Travel vertically */
		/* Let m = dx / dy * 2 * (dx * dy) = 2 * dx * dx */
		qx = ax * ax;
		m = qx << 1;

		ty = grid1.y + sy;

		if (qx == f2) {
			tx = grid1.x + sx;
			qx -= f1;
		} else {
			tx = grid1.x;
		}

		/* Note (below) the case (qx == f2), where */
		/* the LOS exactly meets the corner of a tile. */
		while (grid2.y - ty) {
			if (!square_isprojectable(c, loc(tx, ty)))
				return (false);

			qx += m;

			if (qx < f2) {
				ty += sy;
			} else if (qx > f2) {
				tx += sx;
				if (!square_isprojectable(c, loc(tx, ty)))
					return (false);
				qx -= f1;
				ty += sy;
			} else {
				tx += sx;
				qx -= f1;
				ty += sy;
			}
		}
	}

	/* Assume los */
	return (true);
}